

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::string_t,float,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastStrictOperator<duckdb::TryCast>>
               (string_t *ldata,float *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  ulong *puVar1;
  sel_t *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ValidityMask *pVVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  ValidityMask *pVVar8;
  idx_t idx_in_entry;
  ValidityMask *pVVar9;
  float fVar10;
  string_t input;
  string_t input_00;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_40;
  idx_t local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar2 = sel_vector->sel_vector;
      pVVar9 = (ValidityMask *)0x0;
      pVVar8 = result_mask;
      do {
        pVVar6 = pVVar9;
        if (psVar2 != (sel_t *)0x0) {
          pVVar6 = (ValidityMask *)(ulong)psVar2[(long)pVVar9];
        }
        input_00.value.pointer.ptr = (char *)result_mask;
        input_00.value._0_8_ = ldata[(long)pVVar6].value.pointer.ptr;
        fVar10 = VectorTryCastStrictOperator<duckdb::TryCast>::Operation<duckdb::string_t,float>
                           (*(VectorTryCastStrictOperator<duckdb::TryCast> **)
                             &ldata[(long)pVVar6].value,input_00,pVVar9,(idx_t)dataptr,pVVar8);
        result_data[(long)pVVar9] = fVar10;
        pVVar9 = (ValidityMask *)
                 ((long)&(pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1);
      } while ((ValidityMask *)count != pVVar9);
    }
  }
  else if (count != 0) {
    psVar2 = sel_vector->sel_vector;
    local_40 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    pVVar9 = (ValidityMask *)0x0;
    pVVar8 = result_mask;
    do {
      pVVar6 = pVVar9;
      if (psVar2 != (sel_t *)0x0) {
        pVVar6 = (ValidityMask *)(ulong)psVar2[(long)pVVar9];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[(ulong)pVVar6 >> 6] >>
           ((ulong)pVVar6 & 0x3f) & 1) == 0) {
        if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var5 = p_Stack_50;
          peVar4 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar4;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var5;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_40);
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar7->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar3 = (byte)pVVar9 & 0x3f;
        puVar1 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 ((ulong)pVVar9 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      }
      else {
        input.value.pointer.ptr = (char *)result_mask;
        input.value._0_8_ = ldata[(long)pVVar6].value.pointer.ptr;
        fVar10 = VectorTryCastStrictOperator<duckdb::TryCast>::Operation<duckdb::string_t,float>
                           (*(VectorTryCastStrictOperator<duckdb::TryCast> **)
                             &ldata[(long)pVVar6].value,input,pVVar9,(idx_t)dataptr,pVVar8);
        result_data[(long)pVVar9] = fVar10;
      }
      pVVar9 = (ValidityMask *)
               ((long)&(pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1);
    } while ((ValidityMask *)count != pVVar9);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}